

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_dp.c
# Opt level: O1

int appendDynamic(dynamicPtr *dp,void *src,int size)

{
  int in_EAX;
  int iVar1;
  void *pvVar2;
  int iVar3;
  
  if (dp->dataGood == 0) {
    return in_EAX;
  }
  iVar3 = dp->pos + size;
  if (dp->realSize < iVar3) {
    if (dp->freeOK == 0) {
      return in_EAX;
    }
    iVar1 = overflow2(dp->realSize,2);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar3 = gdReallocDynamic(dp,iVar3 * 2);
    if (iVar3 == 0) {
      dp->dataGood = 0;
      return 0;
    }
  }
  pvVar2 = memcpy((void *)((long)dp->pos + (long)dp->data),src,(long)size);
  iVar3 = size + dp->pos;
  dp->pos = iVar3;
  if (dp->logicalSize < iVar3) {
    dp->logicalSize = iVar3;
  }
  return (int)pvVar2;
}

Assistant:

static int appendDynamic(dynamicPtr * dp, const void *src, int size)
{
	int bytesNeeded;
	char *tmp;

	if(!dp->dataGood) {
		return FALSE;
	}

	/* bytesNeeded = dp->logicalSize + size; */
	bytesNeeded = dp->pos + size;

	if(bytesNeeded > dp->realSize) {
		/* 2.0.21 */
		if(!dp->freeOK) {
			return FALSE;
		}

		if(overflow2(dp->realSize, 2)) {
			return FALSE;
		}

		if(!gdReallocDynamic(dp, bytesNeeded * 2)) {
			dp->dataGood = FALSE;
			return FALSE;
		}
	}

	/* if we get here, we can be sure that we have enough bytes
	 * to copy safely */

	/*printf("Mem OK Size: %d, Pos: %d\n", dp->realSize, dp->pos); */

	tmp = (char *)dp->data;
	memcpy ((void *)(tmp + (dp->pos)), src, size);
	dp->pos += size;

	if(dp->pos > dp->logicalSize) {
		dp->logicalSize = dp->pos;
	};

	return TRUE;
}